

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

int32_t __thiscall icu_63::RBBITableBuilder::removeDuplicateStates(RBBITableBuilder *this)

{
  bool bVar1;
  int iVar2;
  IntPair dupls;
  IntPair local_20;
  
  local_20.first = 3;
  local_20.second = 0;
  iVar2 = 0;
  while( true ) {
    bVar1 = findDuplicateState(this,&local_20);
    if (!bVar1) break;
    removeState(this,local_20);
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int32_t RBBITableBuilder::removeDuplicateStates() {
    IntPair dupls = {3, 0};
    int32_t numStatesRemoved = 0;

    while (findDuplicateState(&dupls)) {
        // printf("Removing duplicate states (%d, %d)\n", dupls.first, dupls.second);
        removeState(dupls);
        ++numStatesRemoved;
    }
    return numStatesRemoved;
}